

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::TrigramInfo::TrigramInfo(TrigramInfo *this,char *pat1,char *pat2,Recycler *recycler)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  memset(this->cachedResult,0,0x100);
  this->isTrigramPattern = true;
  this->hasCachedResultString = false;
  this->triPat1 = 0;
  this->triPat2 = 0;
  this->resultCount = 0;
  iVar2 = 0;
  for (lVar1 = 3; lVar1 != 8; lVar1 = lVar1 + 1) {
    iVar2 = iVar2 * 0x10 + (int)pat1[lVar1];
    this->triPat1 = iVar2;
    iVar3 = iVar3 * 0x10 + (int)pat2[lVar1];
    this->triPat2 = iVar3;
  }
  return;
}

Assistant:

TrigramInfo::TrigramInfo(__in_ecount(PatternLength) char* pat1,__in_ecount(PatternLength) char* pat2, Recycler* recycler)
    {
        isTrigramPattern=true;
        hasCachedResultString = false;

        int k;
        triPat1=0;
        triPat2=0;
        resultCount=0;
        for (k=3;k<PatternLength;k++) {
            triPat1=(triPat1<<4)+pat1[k];
            triPat2=(triPat2<<4)+pat2[k];
        }
    }